

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

bool __thiscall
QUtcTimeZonePrivate::isTimeZoneIdAvailable(QUtcTimeZonePrivate *this,QByteArray *ianaId)

{
  char *pcVar1;
  qsizetype qVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  QByteArrayView ianaIds;
  QByteArrayView id;
  
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if (lVar5 == 0x150) break;
    pcVar1 = (ianaId->d).ptr;
    qVar2 = (ianaId->d).size;
    ianaIds = QtTimeZoneCldr::UtcData::id((UtcData *)(QtTimeZoneCldr::utcDataTable + lVar5));
    id.m_data = pcVar1;
    id.m_size = qVar2;
    bVar4 = isEntryInIanaList(id,ianaIds);
    lVar3 = lVar5 + 8;
  } while (!bVar4);
  return lVar5 != 0x150;
}

Assistant:

bool QUtcTimeZonePrivate::isTimeZoneIdAvailable(const QByteArray &ianaId) const
{
    // Only the zone IDs supplied by CLDR and recognized by constructor.
    for (const UtcData &data : utcDataTable) {
        if (isEntryInIanaList(ianaId, data.id()))
            return true;
    }
    // Callers may want to || offsetFromUtcString(ianaId) != invalidSeconds(),
    // but those are technically not IANA IDs and the custom QTimeZone
    // constructor needs the return here to reflect that.
    return false;
}